

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  uv__queue *puVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  __mode_t __mode;
  int iVar9;
  int iVar10;
  uv_dirent_type_t uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint *puVar15;
  uv__queue *puVar16;
  long lVar17;
  ssize_t sVar18;
  size_t sVar19;
  size_t sVar20;
  uv__queue *puVar21;
  dirent64 *dent;
  char *pcVar22;
  _func_void_uv__work_ptr *p_Var23;
  DIR *pDVar24;
  size_t sVar25;
  ssize_t sVar26;
  uv_loop_s *puVar27;
  _func_void_uv__work_ptr *p_Var28;
  long lVar29;
  _func_void_uv__work_ptr_int *p_Var30;
  ulong uVar31;
  ulong uVar32;
  _func_void_uv__work_ptr_int *p_Var33;
  iovec *piVar34;
  void *__buf;
  code *pcVar35;
  uv__queue *puVar36;
  bool bVar37;
  uint uVar38;
  size_t sVar39;
  pollfd pfd;
  statfs s;
  uv__queue *local_2198;
  _func_void_uv__work_ptr_int *local_2190;
  stat64 local_2158;
  stat64 local_20c8;
  undefined1 local_2038 [16];
  uv__queue *local_2028;
  uint local_2020;
  uint uStack_201c;
  __gid_t local_2018;
  int iStack_2014;
  uv_loop_s *local_2010;
  uv__queue *local_2008;
  __fsid_t _Stack_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  uv__queue *local_1fd0;
  uv__queue *puStack_1fc8;
  char *local_1f28;
  uint local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  
  iVar1 = *(int *)&w[-7].done;
  puVar15 = (uint *)__errno_location();
  buf = &w[-6].loop;
LAB_001512a0:
  *puVar15 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    iVar10 = open64((char *)w[-6].done,*(uint *)((long)&w[-2].wq.next + 4) | 0x80000,
                    (ulong)*(uint *)&w[-2].wq.prev);
    break;
  case 2:
    iVar10 = uv__close_nocancel(*(int *)&w[-2].wq.next);
    if (iVar10 == -1) {
      iVar10 = -(uint)(*puVar15 != 0x73 && *puVar15 != 4);
    }
    break;
  case 3:
    uVar13 = uv__getiovmax();
    uVar38 = *(uint *)((long)&w[-2].wq.prev + 4);
    if (uVar13 < uVar38) {
      *(uint *)((long)&w[-2].wq.prev + 4) = uVar13;
      uVar38 = uVar13;
    }
    p_Var30 = w[-1].done;
    if ((long)p_Var30 < 0) {
      iVar10 = *(int *)&w[-2].wq.next;
      piVar34 = (iovec *)w[-1].work;
      if (uVar38 == 1) {
        puVar16 = (uv__queue *)read(iVar10,piVar34->iov_base,piVar34->iov_len);
      }
      else {
        puVar16 = (uv__queue *)readv(iVar10,piVar34,uVar38);
      }
    }
    else if (uVar38 == 1) {
      puVar16 = (uv__queue *)
                pread64(*(int *)&w[-2].wq.next,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                        (__off64_t)p_Var30);
    }
    else {
      if (uv__fs_read_no_preadv == 0) {
        puVar16 = (uv__queue *)
                  preadv64(*(int *)&w[-2].wq.next,(iovec *)w[-1].work,uVar38,(__off64_t)p_Var30);
        if ((puVar16 != (uv__queue *)0xffffffffffffffff) ||
           (puVar16 = (uv__queue *)0xffffffffffffffff, *puVar15 != 0x26)) goto LAB_00152331;
        uv__fs_read_no_preadv = 1;
        uVar38 = *(uint *)((long)&w[-2].wq.prev + 4);
        p_Var30 = w[-1].done;
      }
      if (uVar38 == 0) {
        __assert_fail("nbufs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/fs.c"
                      ,0x1a8,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
      }
      iVar10 = *(int *)&w[-2].wq.next;
      p_Var23 = w[-1].work;
      p_Var28 = p_Var23 + (ulong)uVar38 * 0x10;
      puVar16 = (uv__queue *)0x0;
      do {
        uVar32 = 0;
        do {
          while (sVar18 = pread64(iVar10,(void *)(*(long *)p_Var23 + uVar32),
                                  *(long *)(p_Var23 + 8) - uVar32,
                                  (__off64_t)(p_Var30 + (long)puVar16)), sVar18 == -1) {
            if ((long)(int)*puVar15 != 4) {
              if (puVar16 == (uv__queue *)0x0) {
                puVar16 = (uv__queue *)-(long)(int)*puVar15;
              }
              goto LAB_00152331;
            }
          }
          if (sVar18 == 0) goto LAB_00152331;
          uVar32 = uVar32 + sVar18;
          puVar16 = (uv__queue *)((long)&puVar16->next + sVar18);
        } while (uVar32 < *(ulong *)(p_Var23 + 8));
        p_Var23 = p_Var23 + 0x10;
      } while (p_Var23 != p_Var28);
    }
LAB_00152331:
    if ((uv__work *)w[-1].work != w + 1) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
    goto LAB_0015207f;
  case 4:
    uVar13 = uv__getiovmax();
    uVar38 = *(uint *)((long)&w[-2].wq.prev + 4);
    ptr = (uv__work *)w[-1].work;
    if (uVar38 != 0) {
      puVar16 = (uv__queue *)0x0;
LAB_00151852:
      uVar12 = uVar13;
      if (uVar38 < uVar13) {
        uVar12 = uVar38;
      }
      *(uint *)((long)&w[-2].wq.prev + 4) = uVar12;
      do {
        p_Var30 = w[-1].done;
        if ((long)p_Var30 < 0) {
          iVar10 = *(int *)&w[-2].wq.next;
          piVar34 = (iovec *)w[-1].work;
          if (uVar12 == 1) {
            puVar21 = (uv__queue *)write(iVar10,piVar34->iov_base,piVar34->iov_len);
          }
          else {
            puVar21 = (uv__queue *)writev(iVar10,piVar34,uVar12);
          }
LAB_001518d1:
          if (-1 < (long)puVar21) goto LAB_00151915;
          uVar12 = *puVar15;
        }
        else {
          if (uVar12 == 1) {
            iVar10 = *(int *)&w[-2].wq.next;
            __buf = *(void **)w[-1].work;
            sVar25 = *(size_t *)(w[-1].work + 8);
LAB_001518b5:
            puVar21 = (uv__queue *)pwrite64(iVar10,__buf,sVar25,(__off64_t)p_Var30);
            goto LAB_001518d1;
          }
          piVar34 = (iovec *)w[-1].work;
          if (uv__fs_write_no_pwritev != 0) {
LAB_001518a8:
            iVar10 = *(int *)&w[-2].wq.next;
            __buf = piVar34->iov_base;
            sVar25 = piVar34->iov_len;
            goto LAB_001518b5;
          }
          puVar21 = (uv__queue *)pwritev64(*(int *)&w[-2].wq.next,piVar34,uVar12,(__off64_t)p_Var30)
          ;
          if (puVar21 != (uv__queue *)0xffffffffffffffff) goto LAB_001518d1;
          uVar12 = *puVar15;
          puVar21 = (uv__queue *)0xffffffffffffffff;
          if (uVar12 == 0x26) {
            uv__fs_write_no_pwritev = 1;
            piVar34 = (iovec *)w[-1].work;
            p_Var30 = w[-1].done;
            goto LAB_001518a8;
          }
        }
        if (uVar12 != 4) goto LAB_00152710;
        uVar12 = *(uint *)((long)&w[-2].wq.prev + 4);
      } while( true );
    }
    puVar16 = (uv__queue *)0x0;
LAB_00152717:
    if (ptr != w + 1) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
    goto LAB_0015207f;
  case 5:
    iVar10 = *(int *)&w[-2].wq.next;
    iVar14 = *(int *)((long)&w[-2].wq.next + 4);
    local_2158.st_dev = (__dev_t)w[-1].done;
    p_Var30 = w[1].done;
    if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_00151447;
    sVar26 = uv__fs_copy_file_range
                       (iVar14,(off_t_conflict *)&local_2158,iVar10,(off_t_conflict *)0x0,
                        (size_t)p_Var30,0);
    if (sVar26 == -1) {
      uVar38 = *puVar15;
      if ((int)uVar38 < 0x12) {
        if (uVar38 == 1) {
          iVar9 = uv__is_cifs_or_smb(iVar10);
          if (iVar9 == 0) {
LAB_00152597:
            uVar38 = *puVar15;
            goto LAB_0015259e;
          }
          goto LAB_00151447;
        }
        if (uVar38 == 0xd) {
          iVar9 = fstatfs64(iVar14,(statfs64 *)local_2038);
          if (((iVar9 == -1) || ((uv_loop_s *)local_2038._0_8_ != (uv_loop_s *)0xc36400)) ||
             (uVar38 = uv__kernel_version(), 0x413ff < uVar38)) goto LAB_00152597;
          goto LAB_00151447;
        }
LAB_0015259e:
        if (uVar38 == 0x26) goto LAB_00151452;
      }
      else {
        if (uVar38 != 0x12) {
          if (uVar38 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
            goto LAB_00152597;
          }
          if (uVar38 != 0x5f) goto LAB_0015259e;
        }
LAB_00151447:
        *puVar15 = 0x26;
LAB_00151452:
        sVar18 = sendfile64(iVar10,iVar14,(__off64_t *)&local_2158,(size_t)p_Var30);
        if (sVar18 != -1) goto LAB_001520e0;
      }
      if ((long)local_2158.st_dev <= (long)w[-1].done) {
        uVar38 = *puVar15;
        if (((uVar38 < 0x17) && ((0x440020U >> (uVar38 & 0x1f) & 1) != 0)) ||
           (puVar16 = (uv__queue *)0xffffffffffffffff, uVar38 == 0x58)) {
          *puVar15 = 0;
          puVar16 = (uv__queue *)w[1].done;
          local_2190 = w[-1].done;
          if (puVar16 != (uv__queue *)0x0) {
            iVar10 = *(int *)&w[-2].wq.next;
            iVar14 = *(int *)((long)&w[-2].wq.next + 4);
            bVar37 = true;
            local_2198 = (uv__queue *)0x0;
LAB_001514e5:
            do {
              sVar25 = (long)puVar16 - (long)local_2198;
              if (0x1fff < sVar25) {
                sVar25 = 0x2000;
              }
LAB_001514fe:
              if (bVar37) {
                sVar19 = pread64(iVar14,local_2038,sVar25,(__off64_t)local_2190);
              }
              else {
                sVar19 = read(iVar14,local_2038,sVar25);
              }
              if (sVar19 == 0xffffffffffffffff) goto code_r0x0015152b;
              if (sVar19 == 0) goto LAB_00152543;
              if (0 < (long)sVar19) {
                lVar29 = 0;
                sVar25 = sVar19;
                do {
                  while (sVar18 = write(iVar10,local_2038 + lVar29,sVar25), sVar18 == -1) {
                    if (*puVar15 != 4) {
                      if (*puVar15 != 0xb) {
                        puVar16 = (uv__queue *)0xffffffffffffffff;
                        goto LAB_0015207f;
                      }
                      local_20c8.st_dev._4_2_ = 4;
                      local_20c8.st_dev._6_2_ = 0;
                      local_20c8.st_dev._0_4_ = iVar10;
                      while (iVar9 = poll((pollfd *)&local_20c8,1,-1), iVar9 == -1) {
                        if (*puVar15 != 4) goto LAB_00152563;
                      }
                      if ((local_20c8.st_dev._6_2_ & 0xfffb) != 0) {
LAB_00152563:
                        *puVar15 = 5;
                        goto LAB_0015256f;
                      }
                    }
                  }
                  lVar29 = lVar29 + sVar18;
                  sVar25 = sVar19 - lVar29;
                } while (sVar25 != 0 && lVar29 <= (long)sVar19);
              }
              local_2190 = local_2190 + sVar19;
              local_2198 = (uv__queue *)((long)&local_2198->next + sVar19);
              if (puVar16 <= local_2198) {
LAB_00152543:
                if (local_2198 == (uv__queue *)0xffffffffffffffff) goto LAB_0015231d;
                goto LAB_00152552;
              }
            } while( true );
          }
          local_2198 = (uv__queue *)0x0;
LAB_00152552:
          w[-1].done = local_2190;
          puVar16 = local_2198;
        }
        goto LAB_0015207f;
      }
    }
LAB_001520e0:
    puVar16 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].done);
    w[-1].done = (_func_void_uv__work_ptr_int *)local_2158.st_dev;
    goto LAB_0015207f;
  case 6:
    p_Var30 = w[-6].done;
    iVar10 = uv__fs_statx(-1,(char *)p_Var30,0,0,(uv_stat_t *)buf);
    if (iVar10 == -0x26) {
      iVar10 = stat64((char *)p_Var30,(stat64 *)local_2038);
LAB_00151ce9:
      if (iVar10 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq.next = (uv__queue *)(ulong)local_2020;
        w[-6].wq.prev = local_2028;
        uVar8 = 0;
        uVar6 = uStack_201c;
        auVar7._0_8_ = CONCAT44(uVar8,uVar6);
        auVar7._8_4_ = local_2018;
        auVar7._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)auVar7._0_8_;
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar7._8_8_;
        w[-5].loop = local_2010;
        w[-5].wq.next = (uv__queue *)local_2038._8_8_;
        w[-5].wq.prev = local_2008;
        w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq.prev = (uv__queue *)local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = (_func_void_uv__work_ptr *)local_1fd0;
        w[-2].done = (_func_void_uv__work_ptr_int *)puStack_1fc8;
        w[-3].wq.next = local_1fd0;
        w[-3].wq.prev = puStack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq.next = (uv__queue *)0x0;
        iVar10 = 0;
      }
    }
    break;
  case 7:
    p_Var30 = w[-6].done;
    iVar10 = uv__fs_statx(-1,(char *)p_Var30,0,1,(uv_stat_t *)buf);
    if (iVar10 == -0x26) {
      iVar10 = lstat64((char *)p_Var30,(stat64 *)local_2038);
      goto LAB_00151ce9;
    }
    break;
  case 8:
    iVar14 = *(int *)&w[-2].wq.next;
    iVar10 = uv__fs_statx(iVar14,"",1,0,(uv_stat_t *)buf);
    if ((iVar10 == -0x26) && (iVar10 = fstat64(iVar14,(stat64 *)local_2038), iVar10 == 0)) {
      w[-6].loop = (uv_loop_s *)local_2038._0_8_;
      w[-6].wq.next = (uv__queue *)(ulong)local_2020;
      w[-6].wq.prev = local_2028;
      uVar5 = 0;
      uVar3 = uStack_201c;
      auVar4._0_8_ = CONCAT44(uVar5,uVar3);
      auVar4._8_4_ = local_2018;
      auVar4._12_4_ = 0;
      w[-5].work = (_func_void_uv__work_ptr *)auVar4._0_8_;
      w[-5].done = (_func_void_uv__work_ptr_int *)auVar4._8_8_;
      w[-5].loop = local_2010;
      w[-5].wq.next = (uv__queue *)local_2038._8_8_;
      w[-5].wq.prev = local_2008;
      w[-4].work = (_func_void_uv__work_ptr *)_Stack_2000.__val;
      w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
      w[-4].wq.prev = (uv__queue *)local_1ff0;
      w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
      w[-3].done = local_1fe0;
      w[-3].loop = puStack_1fd8;
      w[-2].work = (_func_void_uv__work_ptr *)local_1fd0;
      w[-2].done = (_func_void_uv__work_ptr_int *)puStack_1fc8;
      w[-3].wq.next = local_1fd0;
      w[-3].wq.prev = puStack_1fc8;
      w[-4].loop = (uv_loop_s *)0x0;
      w[-4].wq.next = (uv__queue *)0x0;
      iVar10 = 0;
    }
    break;
  case 9:
    iVar10 = ftruncate64(*(int *)&w[-2].wq.next,(__off64_t)w[-1].done);
    break;
  case 10:
    puVar16 = w[-1].wq.next;
    lVar29 = (long)(double)puVar16;
    puVar16 = (uv__queue *)
              (((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000);
    local_2038._0_8_ = ((long)puVar16 >> 0x3f) + lVar29;
    local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar16 + 1000000000.0);
    if (-1 < (long)puVar16) {
      local_2038._8_8_ = puVar16;
    }
    puVar16 = w[-1].wq.prev;
    lVar29 = (long)(double)puVar16;
    lVar17 = ((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000;
    local_2028 = (uv__queue *)((lVar17 >> 0x3f) + lVar29);
    lVar29 = (long)((double)lVar17 + 1000000000.0);
    if (-1 < lVar17) {
      lVar29 = lVar17;
    }
    local_2020 = (uint)lVar29;
    uStack_201c = (uint)((ulong)lVar29 >> 0x20);
    p_Var30 = w[-6].done;
    iVar10 = 0;
    goto LAB_00151757;
  case 0xb:
    puVar16 = w[-1].wq.next;
    lVar29 = (long)(double)puVar16;
    puVar16 = (uv__queue *)
              (((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000);
    local_2038._0_8_ = ((long)puVar16 >> 0x3f) + lVar29;
    local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar16 + 1000000000.0);
    if (-1 < (long)puVar16) {
      local_2038._8_8_ = puVar16;
    }
    puVar16 = w[-1].wq.prev;
    lVar29 = (long)(double)puVar16;
    lVar17 = ((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000;
    local_2028 = (uv__queue *)((lVar17 >> 0x3f) + lVar29);
    lVar29 = (long)((double)lVar17 + 1000000000.0);
    if (-1 < lVar17) {
      lVar29 = lVar17;
    }
    local_2020 = (uint)lVar29;
    uStack_201c = (uint)((ulong)lVar29 >> 0x20);
    iVar10 = futimens(*(int *)&w[-2].wq.next,(timespec *)local_2038);
    break;
  case 0xc:
    iVar10 = access((char *)w[-6].done,*(int *)((long)&w[-2].wq.next + 4));
    break;
  case 0xd:
    iVar10 = chmod((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
    break;
  case 0xe:
    iVar10 = fchmod(*(int *)&w[-2].wq.next,*(__mode_t *)&w[-2].wq.prev);
    break;
  case 0xf:
    iVar10 = fsync(*(int *)&w[-2].wq.next);
    break;
  case 0x10:
    iVar10 = fdatasync(*(int *)&w[-2].wq.next);
    break;
  case 0x11:
    iVar10 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    iVar10 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    iVar10 = mkdir((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
    break;
  case 0x14:
    pcVar22 = mkdtemp((char *)w[-6].done);
    puVar16 = (uv__queue *)-(ulong)(pcVar22 == (char *)0x0);
    goto LAB_0015207f;
  case 0x15:
    iVar10 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038._0_8_ = (uv_loop_s *)0x0;
    iVar10 = scandir64((char *)w[-6].done,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                       uv__fs_scandir_sort);
    *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
    if (iVar10 != -1) {
      puVar27 = (uv_loop_s *)local_2038._0_8_;
      if (iVar10 == 0) {
        free((void *)local_2038._0_8_);
        puVar27 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar27;
      goto LAB_0015215a;
    }
    puVar16 = (uv__queue *)0xffffffffffffffff;
    goto LAB_0015207f;
  case 0x17:
    iVar10 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    iVar10 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar20 = pathconf((char *)w[-6].done,4);
    sVar39 = 0x1000;
    if (sVar20 != 0xffffffffffffffff) {
      sVar39 = sVar20;
    }
    p_Var23 = (_func_void_uv__work_ptr *)uv__malloc(sVar39);
    if (p_Var23 == (_func_void_uv__work_ptr *)0x0) {
      *puVar15 = 0xc;
    }
    else {
      sVar20 = readlink((char *)w[-6].done,(char *)p_Var23,sVar39);
      if (sVar20 == 0xffffffffffffffff) {
        uv__free(p_Var23);
      }
      else if ((sVar20 != sVar39) ||
              (p_Var23 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var23,sVar39 + 1),
              sVar20 = sVar39, p_Var23 != (_func_void_uv__work_ptr *)0x0)) {
        p_Var23[sVar20] = (_func_void_uv__work_ptr)0x0;
        goto LAB_0015280a;
      }
    }
    goto LAB_00152089;
  case 0x1a:
    iVar10 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    iVar10 = fchown(*(int *)&w[-2].wq.next,*(__uid_t *)&w[-1].loop,
                    *(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var23 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var23 != (_func_void_uv__work_ptr *)0x0) goto LAB_0015280a;
    goto LAB_00152089;
  case 0x1d:
    iVar10 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0)
    ;
    uv_fs_req_cleanup((uv_fs_t *)local_2038);
    if (iVar10 < 0) {
      puVar16 = (uv__queue *)(long)iVar10;
    }
    else {
      iVar14 = fstat64(iVar10,&local_20c8);
      __mode = local_20c8.st_mode;
      if (iVar14 == 0) {
        uVar13 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                            (*(uint *)((long)&w[-2].wq.next + 4) & 1) << 7 | 0x41,local_20c8.st_mode
                            ,(uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        uVar38 = uVar13;
        if (-1 < (int)uVar13) {
          if (((ulong)w[-2].wq.next & 0x100000000) == 0) {
            iVar14 = fstat64(uVar13,&local_2158);
            if (iVar14 == 0) {
              if (((_func_void_uv__work_ptr_int *)
                   CONCAT26(local_20c8.st_dev._6_2_,
                            CONCAT24(local_20c8.st_dev._4_2_,(int)local_20c8.st_dev)) ==
                   (_func_void_uv__work_ptr_int *)local_2158.st_dev) &&
                 (local_20c8.st_ino == local_2158.st_ino)) {
                uVar38 = 0;
                goto LAB_00151faf;
              }
              iVar14 = ftruncate64(uVar13,0);
              if ((iVar14 != 0) &&
                 ((p_Var30 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar15, *puVar15 != 0xd ||
                  (0 < local_2158.st_size)))) goto LAB_00151f9b;
              goto LAB_001525db;
            }
LAB_001526dd:
            p_Var30 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar15;
            goto LAB_00151f9b;
          }
LAB_001525db:
          iVar14 = fchmod(uVar13,__mode);
          if (iVar14 == -1) {
            if (*puVar15 != 1) {
              p_Var30 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar15;
              goto LAB_00151f9b;
            }
            iVar14 = uv__is_cifs_or_smb(uVar13);
            if (iVar14 == 0) {
              uVar38 = 0xffffffff;
              goto LAB_00151faf;
            }
          }
          if (((ulong)w[-2].wq.next & 0x600000000) != 0) {
            uVar38 = 0;
            iVar14 = ioctl(uVar13,0x40049409,iVar10);
            if (iVar14 == 0) goto LAB_00151faf;
            if (((ulong)w[-2].wq.next & 0x400000000) != 0) goto LAB_001526dd;
          }
          if (local_20c8.st_size == 0) {
            uVar38 = 0;
          }
          else {
            p_Var33 = (_func_void_uv__work_ptr_int *)0x0;
            sVar39 = local_20c8.st_size;
            do {
              local_2038._8_4_ = 6;
              local_1ff8 = UV_FS_SENDFILE;
              uVar38 = 0;
              local_1f28 = (char *)0x0;
              local_1f10 = (uv_buf_t *)0x0;
              local_1fd0 = (uv__queue *)0x0;
              local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
              puStack_1fd8 = (uv_loop_s *)0x0;
              local_1ff0 = (uv_loop_t *)0x0;
              p_Stack_1fe8 = (uv_fs_cb)0x0;
              local_1f20 = uVar13;
              local_1f1c = iVar10;
              local_1f08 = p_Var33;
              local_1eb8 = sVar39;
              uv__fs_work((uv__work *)(local_2038 + 0x150));
              p_Var30 = local_1fe0;
              uv_fs_req_cleanup((uv_fs_t *)local_2038);
              if ((long)p_Var30 < 0) goto LAB_00151f9b;
              p_Var33 = p_Var33 + (long)p_Var30;
              sVar39 = sVar39 - (long)p_Var30;
            } while (sVar39 != 0);
          }
        }
      }
      else {
        p_Var30 = (_func_void_uv__work_ptr_int *)(ulong)-*puVar15;
        uVar13 = 0xffffffff;
LAB_00151f9b:
        uVar38 = (int)(uint)p_Var30 >> 0x1f & (uint)p_Var30;
      }
LAB_00151faf:
      uVar12 = uv__close_nocheckstdio(iVar10);
      if (uVar12 == 0) {
        uVar12 = uVar38;
      }
      if (uVar38 != 0) {
        uVar12 = uVar38;
      }
      if ((int)uVar13 < 0) {
        if (uVar12 != 0) goto LAB_00152311;
        puVar16 = (uv__queue *)0x0;
      }
      else {
        uVar38 = uv__close_nocheckstdio(uVar13);
        if (uVar38 == 0) {
          uVar38 = uVar12;
        }
        if (uVar12 == 0) {
          uVar12 = uVar38;
        }
        if (uVar12 == 0) {
          puVar16 = (uv__queue *)0x0;
        }
        else {
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
LAB_00152311:
          *puVar15 = -uVar12;
LAB_0015231d:
          puVar16 = (uv__queue *)0xffffffffffffffff;
        }
      }
    }
    goto LAB_0015207f;
  case 0x1e:
    iVar10 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1f:
    p_Var23 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
    if (p_Var23 == (_func_void_uv__work_ptr *)0x0) {
LAB_001520a4:
      uv__free(p_Var23);
      puVar16 = (uv__queue *)0xffffffffffffffff;
      p_Var23 = (_func_void_uv__work_ptr *)0x0;
    }
    else {
      pDVar24 = opendir((char *)w[-6].done);
      *(DIR **)(p_Var23 + 0x30) = pDVar24;
      if (pDVar24 == (DIR *)0x0) goto LAB_001520a4;
      puVar16 = (uv__queue *)0x0;
    }
    w[-6].work = p_Var23;
    goto LAB_0015207f;
  case 0x20:
    p_Var23 = w[-6].work;
    if (*(long *)(p_Var23 + 8) != 0) {
      uVar31 = 0;
      uVar32 = 0;
LAB_00151ac1:
      do {
        *puVar15 = 0;
        dent = readdir64(*(DIR **)(p_Var23 + 0x30));
        uVar38 = (uint)uVar32;
        if (dent == (dirent64 *)0x0) {
          if (*puVar15 != 0) {
LAB_00152218:
            if (uVar38 != 0) {
              lVar29 = 0;
              do {
                uv__free(*(void **)(*(long *)p_Var23 + lVar29));
                *(undefined8 *)(*(long *)p_Var23 + lVar29) = 0;
                lVar29 = lVar29 + 0x10;
              } while (uVar32 << 4 != lVar29);
            }
            uVar38 = 0xffffffff;
          }
          break;
        }
        if ((dent->d_name[0] == '.') &&
           ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0'))))))
        goto LAB_00151afd;
        lVar29 = *(long *)p_Var23;
        pcVar22 = uv__strdup(dent->d_name);
        *(char **)(lVar29 + uVar31 * 0x10) = pcVar22;
        if (pcVar22 == (char *)0x0) goto LAB_00152218;
        uVar11 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar29 + uVar31 * 0x10 + 8) = uVar11;
        uVar38 = uVar38 + 1;
        uVar31 = (ulong)uVar38;
        uVar32 = uVar31;
      } while (uVar31 < *(ulong *)(p_Var23 + 8));
      goto LAB_00152254;
    }
    uVar38 = 0;
LAB_00152254:
    puVar16 = (uv__queue *)(long)(int)uVar38;
    goto LAB_0015207f;
  case 0x21:
    p_Var23 = w[-6].work;
    if (*(DIR **)(p_Var23 + 0x30) != (DIR *)0x0) {
      closedir(*(DIR **)(p_Var23 + 0x30));
      *(undefined8 *)(p_Var23 + 0x30) = 0;
      p_Var23 = w[-6].work;
    }
    uv__free(p_Var23);
    p_Var23 = (_func_void_uv__work_ptr *)0x0;
LAB_0015280a:
    w[-6].work = p_Var23;
    w[-7].wq.prev = (uv__queue *)0x0;
    goto LAB_001527a0;
  case 0x22:
    iVar10 = statfs64((char *)w[-6].done,(statfs64 *)local_2038);
    puVar16 = (uv__queue *)0xffffffffffffffff;
    if (iVar10 == 0) {
      p_Var23 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
      if (p_Var23 == (_func_void_uv__work_ptr *)0x0) {
        *puVar15 = 0xc;
      }
      else {
        *(undefined8 *)p_Var23 = local_2038._0_8_;
        *(undefined8 *)(p_Var23 + 8) = local_2038._8_8_;
        *(uv__queue **)(p_Var23 + 0x10) = local_2028;
        *(long *)(p_Var23 + 0x18) = CONCAT44(uStack_201c,local_2020);
        *(long *)(p_Var23 + 0x20) = CONCAT44(iStack_2014,local_2018);
        *(uv_loop_s **)(p_Var23 + 0x28) = local_2010;
        *(uv__queue **)(p_Var23 + 0x30) = local_2008;
        w[-6].work = p_Var23;
        puVar16 = (uv__queue *)0x0;
      }
    }
    goto LAB_0015207f;
  case 0x23:
    p_Var30 = w[-6].done;
    sVar25 = strlen((char *)p_Var30);
    if ((sVar25 < 6) || (iVar10 = strcmp((char *)(p_Var30 + (sVar25 - 6)),"XXXXXX"), iVar10 != 0)) {
      *puVar15 = 0x16;
      iVar10 = -1;
    }
    else {
      uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
      if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 && uv__fs_mkstemp_no_cloexec_support == 0) {
        iVar10 = (*uv__mkostemp)((char *)p_Var30,0x80000);
        if (-1 < iVar10) goto LAB_0015215a;
        if (*puVar15 != 0x16) goto LAB_00152064;
        uv__fs_mkstemp_no_cloexec_support = 1;
      }
      if (w[-7].wq.next != (uv__queue *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar10 = mkstemp64((char *)p_Var30);
      if ((-1 < iVar10) && (iVar14 = uv__cloexec(iVar10,1), iVar14 != 0)) {
        iVar14 = uv__close(iVar10);
        iVar10 = -1;
        if (iVar14 != 0) {
switchD_001512c6_default:
          abort();
        }
      }
      if (w[-7].wq.next != (uv__queue *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
      if (-1 < iVar10) goto LAB_0015215a;
    }
LAB_00152064:
    *p_Var30 = (_func_void_uv__work_ptr_int)0x0;
LAB_0015215a:
    puVar16 = (uv__queue *)(long)iVar10;
    goto LAB_0015207f;
  case 0x24:
    puVar16 = w[-1].wq.next;
    lVar29 = (long)(double)puVar16;
    puVar16 = (uv__queue *)
              (((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000);
    local_2038._0_8_ = ((long)puVar16 >> 0x3f) + lVar29;
    local_2038._8_8_ = (uv__queue *)(long)((double)(long)puVar16 + 1000000000.0);
    if (-1 < (long)puVar16) {
      local_2038._8_8_ = puVar16;
    }
    puVar16 = w[-1].wq.prev;
    lVar29 = (long)(double)puVar16;
    lVar17 = ((long)(((double)puVar16 - (double)lVar29) * 1000000000.0) / 1000) * 1000;
    local_2028 = (uv__queue *)((lVar17 >> 0x3f) + lVar29);
    lVar29 = (long)((double)lVar17 + 1000000000.0);
    if (-1 < lVar17) {
      lVar29 = lVar17;
    }
    local_2020 = (uint)lVar29;
    uStack_201c = (uint)((ulong)lVar29 >> 0x20);
    p_Var30 = w[-6].done;
    iVar10 = 0x100;
LAB_00151757:
    iVar10 = utimensat(-100,(char *)p_Var30,(timespec *)local_2038,iVar10);
    break;
  default:
    goto switchD_001512c6_default;
  }
  puVar16 = (uv__queue *)(long)iVar10;
  goto LAB_0015207f;
LAB_00151afd:
  if (*(ulong *)(p_Var23 + 8) <= uVar31) goto LAB_00152254;
  goto LAB_00151ac1;
code_r0x0015152b:
  uVar38 = *puVar15;
  if (uVar38 != 4) goto code_r0x00151538;
  goto LAB_001514fe;
code_r0x00151538:
  if ((!bVar37) || (local_2198 != (uv__queue *)0x0)) {
    puVar16 = (uv__queue *)0xffffffffffffffff;
    if ((code *)((long)&local_2198->next + 1U) < (code *)0x2) goto LAB_0015207f;
    goto LAB_00152552;
  }
  bVar37 = false;
  local_2198 = (uv__queue *)0x0;
  if ((uVar38 == 5) || (local_2198 = (uv__queue *)0x0, uVar38 == 0x1d)) goto LAB_001514e5;
LAB_0015256f:
  puVar16 = (uv__queue *)0xffffffffffffffff;
LAB_0015207f:
  if (puVar16 != (uv__queue *)0xffffffffffffffff) {
    w[-7].wq.prev = puVar16;
    if (puVar16 != (uv__queue *)0x0) {
      return;
    }
LAB_001527a0:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)buf;
    return;
  }
LAB_00152089:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar15 != 4)) {
    w[-7].wq.prev = (uv__queue *)-(long)(int)*puVar15;
    return;
  }
  goto LAB_001512a0;
LAB_00151915:
  if (puVar21 == (uv__queue *)0x0) {
    puVar21 = (uv__queue *)0x0;
LAB_00152710:
    if (puVar16 == (uv__queue *)0x0) {
      puVar16 = puVar21;
    }
    goto LAB_00152717;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)puVar21;
  }
  p_Var23 = w[-1].work;
  pcVar35 = p_Var23 + 8;
  uVar12 = 0;
  puVar36 = puVar21;
  do {
    puVar2 = *(uv__queue **)pcVar35;
    if (puVar36 <= puVar2 && (long)puVar2 - (long)puVar36 != 0) {
      *(code **)(pcVar35 + -8) = (code *)((long)&puVar36->next + *(ulong *)(pcVar35 + -8));
      *(long *)pcVar35 = (long)puVar2 - (long)puVar36;
      p_Var23 = w[-1].work;
      break;
    }
    uVar12 = uVar12 + 1;
    pcVar35 = pcVar35 + 0x10;
    puVar36 = (uv__queue *)((long)puVar36 - (long)puVar2);
  } while (puVar36 != (uv__queue *)0x0);
  *(uint *)((long)&w[-2].wq.prev + 4) = uVar12;
  w[-1].work = p_Var23 + (ulong)uVar12 * 0x10;
  puVar16 = (uv__queue *)((long)&puVar16->next + (long)puVar21);
  uVar38 = uVar38 - uVar12;
  if (uVar38 == 0) goto LAB_00152717;
  goto LAB_00151852;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}